

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_unitvect_pack_adaptproj(double *in,double *out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_30;
  double invz;
  double absy;
  double absx;
  double *out_local;
  double *in_local;
  
  dVar2 = ABS(*in);
  dVar3 = ABS(in[1]);
  dVar1 = dVar3;
  if (dVar3 <= dVar2) {
    dVar1 = dVar2;
  }
  if ((double)(~-(ulong)NAN(dVar2) & (ulong)dVar1 | -(ulong)NAN(dVar2) & (ulong)dVar3) <= ABS(in[2])
     ) {
    *out = *in;
    out[1] = in[1];
    out[2] = in[2];
  }
  else {
    if ((in[2] != 0.0) || (NAN(in[2]))) {
      local_30 = 1.0 / in[2];
    }
    else {
      local_30 = INFINITY;
    }
    if (dVar2 < dVar3) {
      *out = *in;
      out[1] = local_30;
      out[2] = in[1];
    }
    else {
      *out = local_30;
      out[1] = in[1];
      out[2] = *in;
    }
  }
  out[2] = (double)((ulong)out[2] & 0x8000000000000000 | 0x3ff0000000000000);
  return;
}

Assistant:

MCPL_LOCAL void mcpl_unitvect_pack_adaptproj(const double* in, double* out) {

  //Precise packing of unit vector into 2 floats + 1 bit using the "Adaptive
  //Projection Packing" method (T. Kittelmann, 2017).
  //
  //The Adaptive Projection Packing method is a variant on the traditional projection
  //method where one would store (x,y,sign(z)) and upon unpacking recover the
  //magnitude of z with |z|=sqrt(1-x^2-y^2), a formula which suffers from
  //numerical precision issues when |z| is small. In this improved version, one
  //gets rid of the precision issues by always storing the components that are
  //smallest in magnitude (the last one must then have a magnitude in the
  //interval [1/sqrt(3),1] = [0.577,1.0] which is never small). This just leaves
  //the issue of being able to recognise the coordinate choices again upon
  //unpacking. Since all components are at most of unit magnitude, this is
  //achieved by storing 1/z rather than z and replacing either x or y as
  //needed (infinity when z=0). Thus, the packed data will contain:
  //
  //              ( 1/z,  y, sign(x) ) when |x|>|y|,|z|
  //              ( x,  1/z, sign(y) ) when |y|>|x|,|z|
  //              ( x,    y, sign(z) ) when |z|>|x|,|y|
  //
  //The unpacking code can determine which of the three scenarios is used to
  //encode a given piece of data by checking if the first or second field is
  //greater than unity.
  //
  //Note that the arrays "in" and "out" are both of dimension 3, however out[2]
  //will contain only binary information, in the form of the sign of the
  //component which was projected away (-1.0 or 1.0).
  const double absx = fabs(in[0]);
  const double absy = fabs(in[1]);
  if ( fabs(in[2]) < fmax(absx,absy) ) {
    const double invz = ( in[2] ? (1.0/in[2]) : INFINITY );
    if (absx>=absy) {
      //output (1/z,y,sign(x))
      out[0] = invz; out[1] = in[1]; out[2] = in[0];
    } else {
      //output (x,1/z,sign(y))
      out[0] = in[0]; out[1] = invz; out[2] = in[1];
    }
  } else {
    //output (x,y,sign(z))
    out[0] = in[0]; out[1] = in[1]; out[2] = in[2];
  }
  out[2] = copysign(1.0,out[2]);
}